

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<__int128>::Visit
          (PrecomputeVisitor<__int128> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  bool bVar1;
  BinaryType BVar2;
  element_type *peVar3;
  shared_ptr<const_calc4::Operator> *in_RDI;
  __int128 result;
  __int128 rightValue;
  __int128 leftValue;
  shared_ptr<const_calc4::Operator> right;
  shared_ptr<const_calc4::Operator> left;
  shared_ptr<const_calc4::BinaryOperator> *in_stack_ffffffffffffff48;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff68;
  BinaryType in_stack_ffffffffffffff6c;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffff70;
  PrecomputeVisitor<__int128> *in_stack_ffffffffffffff78;
  long local_68;
  long local_60;
  
  peVar3 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x141861);
  BinaryOperator::GetLeft(peVar3);
  Precompute((PrecomputeVisitor<__int128> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),in_RDI);
  peVar3 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14188b);
  BinaryOperator::GetRight(peVar3);
  Precompute((PrecomputeVisitor<__int128> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),in_RDI);
  bVar1 = TryGetPrecomputedValue
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     (__int128 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if ((bVar1) &&
     (bVar1 = TryGetPrecomputedValue
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         (__int128 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
     bVar1)) {
    peVar3 = std::
             __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14190b);
    BVar2 = BinaryOperator::GetType(peVar3);
    if (BVar2 != Div) {
      peVar3 = std::
               __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x141925);
      BVar2 = BinaryOperator::GetType(peVar3);
      if (BVar2 != Mod) goto LAB_00141947;
    }
    if (local_68 != 0 || local_60 != 0) {
LAB_00141947:
      peVar3 = std::
               __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x141954);
      BVar2 = BinaryOperator::GetType(peVar3);
      (*(code *)(&DAT_0018bfd8 + *(int *)(&DAT_0018bfd8 + (ulong)BVar2 * 4)))();
      return;
    }
  }
  peVar3 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x141bf8);
  BinaryOperator::GetType(peVar3);
  BinaryOperator::Create
            ((shared_ptr<const_calc4::Operator> *)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  std::shared_ptr<calc4::Operator_const>::operator=
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::shared_ptr<const_calc4::BinaryOperator>::~shared_ptr
            ((shared_ptr<const_calc4::BinaryOperator> *)0x141c3b);
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x141c48)
  ;
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x141c55)
  ;
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        std::shared_ptr<const Operator> left = Precompute(op->GetLeft());
        std::shared_ptr<const Operator> right = Precompute(op->GetRight());

        TNumber leftValue, rightValue;
        if (TryGetPrecomputedValue(left, &leftValue) &&
            TryGetPrecomputedValue(right, &rightValue) &&
            !((op->GetType() == BinaryType::Div || op->GetType() == BinaryType::Mod) &&
              rightValue == 0))
        {
            TNumber result;

            switch (op->GetType())
            {
            case BinaryType::Add:
                result = leftValue + rightValue;
                break;
            case BinaryType::Sub:
                result = leftValue - rightValue;
                break;
            case BinaryType::Mult:
                result = leftValue * rightValue;
                break;
            case BinaryType::Div:
                result = leftValue / rightValue;
                break;
            case BinaryType::Mod:
                result = leftValue % rightValue;
                break;
            case BinaryType::Equal:
                result = (leftValue == rightValue) ? 1 : 0;
                break;
            case BinaryType::NotEqual:
                result = (leftValue != rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThan:
                result = (leftValue < rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThanOrEqual:
                result = (leftValue <= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThanOrEqual:
                result = (leftValue >= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThan:
                result = (leftValue > rightValue) ? 1 : 0;
                break;
            default:
                UNREACHABLE();
                break;
            }

            value = PrecomputedOperator::Create(result);
        }
        else
        {
            value = BinaryOperator::Create(left, right, op->GetType());
        }
    }